

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O3

Amap_Item_t * Amap_LibertyCellOutput(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  uint uVar1;
  Amap_Pair_t AVar2;
  int iVar3;
  Amap_Item_t *pAVar4;
  int iVar5;
  Amap_Item_t *pPin;
  
  uVar1 = pCell->Child;
  iVar5 = p->nItems;
  if ((int)uVar1 < iVar5) {
    if ((-1 < (int)uVar1) && (p->pItems != (Amap_Item_t *)0x0)) {
      pPin = p->pItems + uVar1;
      do {
        AVar2 = pPin->Key;
        iVar3 = strncmp(p->pContents + AVar2.Beg,"pin",(long)AVar2 - ((long)AVar2 << 0x20) >> 0x20);
        if (iVar3 == 0) {
          pAVar4 = Amap_LibertyPinFunction(p,pPin);
          if (pAVar4 != (Amap_Item_t *)0x0) {
            return pPin;
          }
          iVar5 = p->nItems;
        }
        uVar1 = pPin->Next;
        if (iVar5 <= (int)uVar1) goto LAB_003c347b;
      } while ((-1 < (int)uVar1) && (pPin = p->pItems + uVar1, p->pItems != (Amap_Item_t *)0x0));
    }
    return (Amap_Item_t *)0x0;
  }
LAB_003c347b:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapLiberty.c"
                ,0x49,"Amap_Item_t *Amap_LibertyItem(Amap_Tree_t *, int)");
}

Assistant:

Amap_Item_t * Amap_LibertyCellOutput( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pPin;
    Amap_ItemForEachChild( p, pCell, pPin )
    {
        if ( Amap_LibertyCompare(p, pPin->Key, "pin") )
            continue;
        if ( Amap_LibertyPinFunction(p, pPin) )
            return pPin;
    }
    return NULL;
}